

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError set_rate(GlobalConfig *global,char *nextarg)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong local_80;
  curl_off_t local_78;
  curl_off_t numunits;
  size_t numlen;
  long numerator;
  long denominator;
  char number [26];
  char *local_30;
  char *div;
  char *pcStack_20;
  ParameterError err;
  char *nextarg_local;
  GlobalConfig *global_local;
  
  div._4_4_ = 0;
  pcStack_20 = nextarg;
  nextarg_local = (char *)global;
  local_30 = strchr(nextarg,0x2f);
  numlen = 3600000;
  if (local_30 == (char *)0x0) {
    local_80 = strlen(pcStack_20);
  }
  else {
    local_80 = (long)local_30 - (long)pcStack_20;
  }
  numunits = local_80;
  if (local_80 < 0x1a) {
    memcpy(&denominator,pcStack_20,local_80);
    number[numunits + -8] = '\0';
    div._4_4_ = str2unum(&numerator,(char *)&denominator);
    global_local._4_4_ = div._4_4_;
    if (div._4_4_ == PARAM_OK) {
      if (numerator < 1) {
        global_local._4_4_ = PARAM_BAD_USE;
      }
      else {
        if (local_30 != (char *)0x0) {
          local_30 = local_30 + 1;
          iVar2 = Curl_str_number(&local_30,&local_78,0x7fffffffffffffff);
          if (iVar2 != 0) {
            local_78 = 1;
          }
          switch(*local_30) {
          case 'd':
            numlen = 86400000;
            break;
          default:
            errorf((GlobalConfig *)nextarg_local,"unsupported --rate unit");
            div._4_4_ = PARAM_BAD_USE;
            break;
          case 'h':
            break;
          case 'm':
            numlen = 60000;
            break;
          case 's':
            numlen = 1000;
          }
          auVar1._8_8_ = 0;
          auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
          auVar1 = auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff);
          if (SUB168(auVar1 / SEXT816((long)numlen),0) < local_78) {
            errorf((GlobalConfig *)nextarg_local,"too large --rate unit",
                   SUB168(auVar1 % SEXT816((long)numlen),0));
            div._4_4_ = PARAM_NUMBER_TOO_LARGE;
          }
          numlen = local_78 * numlen;
        }
        if (div._4_4_ == PARAM_OK) {
          if ((long)numlen < numerator) {
            div._4_4_ = PARAM_NUMBER_TOO_LARGE;
          }
          else {
            *(long *)(nextarg_local + 0x50) = (long)numlen / numerator;
          }
        }
        global_local._4_4_ = div._4_4_;
      }
    }
  }
  else {
    global_local._4_4_ = PARAM_NUMBER_TOO_LARGE;
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError set_rate(struct GlobalConfig *global,
                               const char *nextarg)
{
  /* --rate */
  /* support a few different suffixes, extract the suffix first, then
     get the number and convert to per hour.
     /s == per second
     /m == per minute
     /h == per hour (default)
     /d == per day (24 hours)
  */
  ParameterError err = PARAM_OK;
  const char *div = strchr(nextarg, '/');
  char number[26];
  long denominator;
  long numerator = 60*60*1000; /* default per hour */
  size_t numlen = div ? (size_t)(div - nextarg) : strlen(nextarg);
  if(numlen > sizeof(number) -1)
    return PARAM_NUMBER_TOO_LARGE;

  memcpy(number, nextarg, numlen);
  number[numlen] = 0;
  err = str2unum(&denominator, number);
  if(err)
    return err;

  if(denominator < 1)
    return PARAM_BAD_USE;

  if(div) {
    curl_off_t numunits;
    div++;

    if(curlx_str_number(&div, &numunits, CURL_OFF_T_MAX))
      numunits = 1;

    switch(*div) {
    case 's': /* per second */
      numerator = 1000;
      break;
    case 'm': /* per minute */
      numerator = 60*1000;
      break;
    case 'h': /* per hour */
      break;
    case 'd': /* per day */
      numerator = 24*60*60*1000;
      break;
    default:
      errorf(global, "unsupported --rate unit");
      err = PARAM_BAD_USE;
      break;
    }

    if((LONG_MAX / numerator) < numunits) {
      /* overflow, too large number */
      errorf(global, "too large --rate unit");
      err = PARAM_NUMBER_TOO_LARGE;
    }
    /* this typecast is okay based on the check above */
    numerator *= (long)numunits;
  }

  if(err)
    ;
  else if(denominator > numerator)
    err = PARAM_NUMBER_TOO_LARGE;
  else
    global->ms_per_transfer = numerator/denominator;

  return err;
}